

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall ASN1Test_Pack_Test::TestBody(ASN1Test_Pack_Test *this)

{
  bool bVar1;
  int iVar2;
  BASIC_CONSTRAINTS *__p;
  char *pcVar3;
  pointer pBVar4;
  ASN1_STRING *pAVar5;
  pointer paVar6;
  uchar *puVar7;
  char *in_R9;
  AssertHelper local_2c8;
  Message local_2c0;
  Span<const_unsigned_char> local_2b8;
  Bytes local_2a8;
  Bytes local_298;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_4;
  Message local_270;
  pointer local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_230;
  Message local_228;
  ASN1_STRING *local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__3;
  Message local_1c0;
  Span<const_unsigned_char> local_1b8;
  Bytes local_1a8;
  Bytes local_198;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  Message local_170;
  pointer local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_130;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__2;
  ASN1_STRING *raw;
  Message local_100;
  Span<const_unsigned_char> local_f8;
  Bytes local_e8;
  Bytes local_d8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<ASN1_STRING> str;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BASIC_CONSTRAINTS> val;
  ASN1Test_Pack_Test *this_local;
  
  __p = BASIC_CONSTRAINTS_new();
  std::unique_ptr<BASIC_CONSTRAINTS_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<BASIC_CONSTRAINTS_st,bssl::internal::Deleter> *)&gtest_ar_.message_,
             (pointer)__p);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<BASIC_CONSTRAINTS_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x826df3,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x808,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    pBVar4 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    pBVar4->ca = 0;
    pBVar4 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    pAVar5 = ASN1_item_pack(pBVar4,(ASN1_ITEM *)&BASIC_CONSTRAINTS_it,(ASN1_OCTET_STRING **)0x0);
    std::unique_ptr<asn1_string_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<asn1_string_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (pointer)pAVar5);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_88,(AssertionResult *)0x8244ba,
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x80f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      paVar6 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                          &gtest_ar__1.message_);
      puVar7 = ASN1_STRING_get0_data(paVar6);
      paVar6 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                          &gtest_ar__1.message_);
      iVar2 = ASN1_STRING_length((ASN1_STRING *)paVar6);
      Bytes::Bytes(&local_d8,puVar7,(long)iVar2);
      bssl::Span<unsigned_char_const>::Span<2ul>
                ((Span<unsigned_char_const> *)&local_f8,(uchar (*) [2])"0");
      Bytes::Bytes(&local_e8,local_f8);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_c8,
                 "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
                 "Bytes(kExpected)",&local_d8,&local_e8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&raw,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x812,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&raw,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&raw);
        testing::Message::~Message(&local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      gtest_ar__2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      pBVar4 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      pAVar5 = ASN1_item_pack(pBVar4,(ASN1_ITEM *)&BASIC_CONSTRAINTS_it,
                              (ASN1_OCTET_STRING **)&gtest_ar__2.message_);
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::reset
                ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                 (pointer)pAVar5);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_120,
                 (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1.message_,(internal *)local_120,(AssertionResult *)0x8244ba,
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x816,pcVar3);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
      if (bVar1) {
        local_168 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                               &gtest_ar__1.message_);
        testing::internal::EqHelper::Compare<asn1_string_st_*,_asn1_string_st_*,_nullptr>
                  ((EqHelper *)local_160,"raw","str.get()",(asn1_string_st **)&gtest_ar__2.message_,
                   &local_168);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar1) {
          testing::Message::Message(&local_170);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x817,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_170);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        paVar6 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                            &gtest_ar__1.message_);
        puVar7 = ASN1_STRING_get0_data(paVar6);
        paVar6 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                            &gtest_ar__1.message_);
        iVar2 = ASN1_STRING_length((ASN1_STRING *)paVar6);
        Bytes::Bytes(&local_198,puVar7,(long)iVar2);
        bssl::Span<unsigned_char_const>::Span<2ul>
                  ((Span<unsigned_char_const> *)&local_1b8,(uchar (*) [2])"0");
        Bytes::Bytes(&local_1a8,local_1b8);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_188,
                   "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
                   "Bytes(kExpected)",&local_198,&local_1a8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
        if (!bVar1) {
          testing::Message::Message(&local_1c0);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x81a,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__3.message_,&local_1c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_1c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
        pAVar5 = ASN1_STRING_new();
        std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::reset
                  ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                   (pointer)pAVar5);
        testing::AssertionResult::
        AssertionResult<std::unique_ptr<asn1_string_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_1d8,
                   (unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
                   (type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
        if (!bVar1) {
          testing::Message::Message(&local_1e0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_1d8,
                     (AssertionResult *)0x8244ba,"false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x81d,pcVar3);
          testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
          testing::internal::AssertHelper::~AssertHelper(&local_1e8);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_1e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
        if (bVar1) {
          gtest_ar__2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                            &gtest_ar__1.message_);
          pBVar4 = std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          local_220 = ASN1_item_pack(pBVar4,(ASN1_ITEM *)&BASIC_CONSTRAINTS_it,
                                     (ASN1_OCTET_STRING **)&gtest_ar__2.message_);
          testing::AssertionResult::AssertionResult<asn1_string_st*>
                    ((AssertionResult *)local_218,(asn1_string_st **)&local_220,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
          if (!bVar1) {
            testing::Message::Message(&local_228);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_3.message_,(internal *)local_218,
                       (AssertionResult *)
                       "ASN1_item_pack(val.get(), (&(BASIC_CONSTRAINTS_it)), &raw)","false","true",
                       in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_230,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x820,pcVar3);
            testing::internal::AssertHelper::operator=(&local_230,&local_228);
            testing::internal::AssertHelper::~AssertHelper(&local_230);
            std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_228);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
          local_268 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          testing::internal::EqHelper::Compare<asn1_string_st_*,_asn1_string_st_*,_nullptr>
                    ((EqHelper *)local_260,"raw","str.get()",
                     (asn1_string_st **)&gtest_ar__2.message_,&local_268);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
          if (!bVar1) {
            testing::Message::Message(&local_270);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x821,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_270);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_270);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
          paVar6 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          puVar7 = ASN1_STRING_get0_data(paVar6);
          paVar6 = std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          iVar2 = ASN1_STRING_length((ASN1_STRING *)paVar6);
          Bytes::Bytes(&local_298,puVar7,(long)iVar2);
          bssl::Span<unsigned_char_const>::Span<2ul>
                    ((Span<unsigned_char_const> *)&local_2b8,(uchar (*) [2])"0");
          Bytes::Bytes(&local_2a8,local_2b8);
          testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                    ((EqHelper *)local_288,
                     "Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get()))",
                     "Bytes(kExpected)",&local_298,&local_2a8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
          if (!bVar1) {
            testing::Message::Message(&local_2c0);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                       ,0x824,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
            testing::internal::AssertHelper::~AssertHelper(&local_2c8);
            testing::Message::~Message(&local_2c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
        }
      }
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ASN1Test, Pack) {
  bssl::UniquePtr<BASIC_CONSTRAINTS> val(BASIC_CONSTRAINTS_new());
  ASSERT_TRUE(val);
  val->ca = 0;

  // Test all three calling conventions.
  static const uint8_t kExpected[] = {0x30, 0x00};
  bssl::UniquePtr<ASN1_STRING> str(
      ASN1_item_pack(val.get(), ASN1_ITEM_rptr(BASIC_CONSTRAINTS), nullptr));
  ASSERT_TRUE(str);
  EXPECT_EQ(
      Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get())),
      Bytes(kExpected));

  ASN1_STRING *raw = nullptr;
  str.reset(ASN1_item_pack(val.get(), ASN1_ITEM_rptr(BASIC_CONSTRAINTS), &raw));
  ASSERT_TRUE(str);
  EXPECT_EQ(raw, str.get());
  EXPECT_EQ(
      Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get())),
      Bytes(kExpected));

  str.reset(ASN1_STRING_new());
  ASSERT_TRUE(str);
  raw = str.get();
  EXPECT_TRUE(
      ASN1_item_pack(val.get(), ASN1_ITEM_rptr(BASIC_CONSTRAINTS), &raw));
  EXPECT_EQ(raw, str.get());
  EXPECT_EQ(
      Bytes(ASN1_STRING_get0_data(str.get()), ASN1_STRING_length(str.get())),
      Bytes(kExpected));
}